

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool mz_zip_writer_add_mem_ex_v2
                  (mz_zip_archive *pZip,char *pArchive_name,void *pBuf,size_t buf_size,
                  void *pComment,mz_uint16 comment_size,mz_uint level_and_flags,
                  mz_uint64 uncomp_size,mz_uint32 uncomp_crc32,time_t *last_modified,
                  char *user_extra_data,mz_uint user_extra_data_len,char *user_extra_data_central,
                  mz_uint user_extra_data_central_len)

{
  bool bVar1;
  mz_bool mVar2;
  uint uVar3;
  tdefl_status tVar4;
  mz_ulong mVar5;
  size_t sVar6;
  mz_zip_internal_state *pmVar7;
  ulong in_RCX;
  mz_uint8 *in_RDX;
  char *in_RSI;
  long lVar8;
  mz_zip_archive *in_RDI;
  long in_R8;
  ushort in_R9W;
  uint in_stack_00000008;
  ulong in_stack_00000010;
  undefined4 in_stack_00000018;
  long in_stack_00000020;
  void *in_stack_00000028;
  uint in_stack_00000030;
  uint in_stack_00000040;
  mz_uint32 local_dir_footer_size;
  mz_uint8 local_dir_footer [24];
  mz_zip_writer_add_state state;
  time_t cur_time;
  mz_uint16 bit_flags;
  mz_uint8 extra_data [28];
  mz_uint32 extra_size;
  mz_uint8 *pExtra_data;
  mz_zip_internal_state *pState;
  mz_bool store_data_uncompressed;
  tdefl_compressor *pComp;
  mz_uint8 local_dir_header [30];
  size_t archive_name_size;
  mz_uint64 comp_size;
  mz_uint64 cur_archive_file_ofs;
  mz_uint64 local_dir_header_ofs;
  mz_uint num_alignment_padding_bytes;
  mz_uint ext_attributes;
  mz_uint level;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  mz_uint16 method;
  mz_uint32 in_stack_00000b84;
  mz_uint64 in_stack_00000b88;
  mz_zip_archive *in_stack_00000b90;
  tdefl_flush in_stack_fffffffffffffb6c;
  mz_uint16 *in_stack_fffffffffffffb70;
  undefined4 uVar9;
  void *pPut_buf_user;
  mz_uint16 *in_stack_fffffffffffffb78;
  undefined4 uVar10;
  tdefl_put_buf_func_ptr pPut_buf_func;
  undefined4 in_stack_fffffffffffffb80;
  mz_uint in_stack_fffffffffffffb84;
  undefined4 in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb8c;
  undefined4 in_stack_fffffffffffffb90;
  mz_uint16 in_stack_fffffffffffffb94;
  mz_uint16 in_stack_fffffffffffffb96;
  undefined4 in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffb9c;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  mz_uint64 *in_stack_fffffffffffffbe8;
  undefined8 in_stack_fffffffffffffbf0;
  mz_uint16 extra_size_00;
  mz_uint64 *in_stack_fffffffffffffbf8;
  mz_uint64 *pComp_size;
  undefined8 in_stack_fffffffffffffc00;
  mz_uint16 filename_size;
  mz_uint64 *in_stack_fffffffffffffc08;
  mz_uint64 *pUncomp_size;
  mz_zip_archive *in_stack_fffffffffffffc10;
  mz_uint64 *local_3e0;
  mz_uint64 *local_3d0;
  mz_uint64 *local_3c0;
  bool local_3ad;
  uint local_3ac;
  undefined1 local_3a8;
  undefined1 local_3a7;
  undefined1 local_3a6;
  undefined1 local_3a5;
  undefined1 local_3a4;
  undefined1 local_3a3;
  undefined1 local_3a2;
  undefined1 local_3a1;
  mz_uint32 in_stack_fffffffffffffc60;
  undefined1 local_39c;
  undefined1 local_39b;
  undefined1 local_39a;
  undefined1 local_399;
  mz_uint16 in_stack_fffffffffffffc68;
  mz_uint16 in_stack_fffffffffffffc70;
  mz_uint16 in_stack_fffffffffffffc78;
  mz_uint64 mVar11;
  mz_uint16 in_stack_fffffffffffffc80;
  mz_uint64 mVar12;
  time_t local_378;
  ushort local_36a;
  mz_zip_archive local_368;
  mz_uint64 local_2f8;
  mz_uint64 local_2f0;
  mz_uint64 local_2e8;
  mz_uint local_2dc;
  uint local_2d8;
  uint local_2d4;
  ushort local_2d0;
  ushort local_2ce;
  ushort local_2cc;
  ushort local_2ca;
  ulong local_2c0;
  mz_uint8 *local_2b8;
  char *local_2b0;
  mz_zip_archive *local_2a8;
  mz_uint16 in_stack_fffffffffffffe90;
  mz_uint64 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  mz_uint32 in_stack_fffffffffffffea8;
  mz_uint16 in_stack_fffffffffffffeb0;
  mz_uint16 in_stack_fffffffffffffeb8;
  mz_uint16 in_stack_fffffffffffffec0;
  mz_uint16 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  mz_uint32 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  mz_uint in_stack_fffffffffffffee8;
  
  filename_size = (mz_uint16)((ulong)in_stack_fffffffffffffc00 >> 0x30);
  extra_size_00 = (mz_uint16)((ulong)in_stack_fffffffffffffbf0 >> 0x30);
  local_2cc = 0;
  local_2ce = 0;
  local_2d0 = 0;
  local_2d8 = 0;
  local_2e8 = in_RDI->m_archive_size;
  local_2f0 = in_RDI->m_archive_size;
  local_2f8 = 0;
  local_368.m_pRealloc = (mz_realloc_func)0x0;
  local_368.m_file_offset_alignment = 0;
  local_368.m_last_error = MZ_ZIP_NO_ERROR;
  local_36a = 0;
  if ((int)in_stack_00000008 < 0) {
    in_stack_00000008 = 6;
  }
  if ((in_stack_00000010 != 0) || ((in_RCX != 0 && ((in_stack_00000008 & 0x400) == 0)))) {
    local_36a = 8;
  }
  if ((in_stack_00000008 & 0x10000) == 0) {
    local_36a = local_36a | 0x800;
  }
  local_2d4 = in_stack_00000008 & 0xf;
  local_3ad = local_2d4 == 0 || (in_stack_00000008 & 0x400) != 0;
  local_368.m_pFree._4_4_ = (uint)local_3ad;
  if ((((((in_RDI == (mz_zip_archive *)0x0) || (in_RDI->m_pState == (mz_zip_internal_state *)0x0))
        || (in_RDI->m_zip_mode != MZ_ZIP_MODE_WRITING)) ||
       ((in_RCX != 0 && (in_RDX == (mz_uint8 *)0x0)))) ||
      ((in_RSI == (char *)0x0 || ((in_R9W != 0 && (in_R8 == 0)))))) || (10 < local_2d4)) {
    if (in_RDI != (mz_zip_archive *)0x0) {
      in_RDI->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    }
  }
  else {
    local_368.m_pAlloc = (mz_alloc_func)in_RDI->m_pState;
    if (((mz_zip_internal_state *)local_368.m_pAlloc)->m_zip64 == 0) {
      if (in_RDI->m_total_files == 0xffff) {
        ((mz_zip_internal_state *)local_368.m_pAlloc)->m_zip64 = 1;
      }
      if ((0xffffffff < in_RCX) || (0xffffffff < in_stack_00000010)) {
        ((mz_zip_internal_state *)local_368.m_pAlloc)->m_zip64 = 1;
      }
    }
    else if (in_RDI->m_total_files == 0xffffffff) {
      if (in_RDI != (mz_zip_archive *)0x0) {
        in_RDI->m_last_error = MZ_ZIP_TOO_MANY_FILES;
      }
      return 0;
    }
    if (((in_stack_00000008 & 0x400) == 0) && (in_stack_00000010 != 0)) {
      if (in_RDI != (mz_zip_archive *)0x0) {
        in_RDI->m_last_error = MZ_ZIP_INVALID_PARAMETER;
      }
    }
    else {
      local_2ca = in_R9W;
      local_2c0 = in_RCX;
      local_2b8 = in_RDX;
      local_2b0 = in_RSI;
      local_2a8 = in_RDI;
      mVar2 = mz_zip_writer_validate_archive_name(in_RSI);
      if (mVar2 == 0) {
        if (local_2a8 != (mz_zip_archive *)0x0) {
          local_2a8->m_last_error = MZ_ZIP_INVALID_FILENAME;
        }
      }
      else {
        if (in_stack_00000020 == 0) {
          time(&local_378);
          mz_zip_time_t_to_dos_time
                    (CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                     in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
          uVar10 = (undefined4)((ulong)in_stack_fffffffffffffb78 >> 0x20);
          uVar9 = (undefined4)((ulong)in_stack_fffffffffffffb70 >> 0x20);
        }
        else {
          mz_zip_time_t_to_dos_time
                    (CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                     in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
          uVar10 = (undefined4)((ulong)in_stack_fffffffffffffb78 >> 0x20);
          uVar9 = (undefined4)((ulong)in_stack_fffffffffffffb70 >> 0x20);
        }
        if ((in_stack_00000008 & 0x400) == 0) {
          mVar5 = mz_crc32(0,local_2b8,local_2c0);
          in_stack_00000018 = (undefined4)mVar5;
          in_stack_00000010 = local_2c0;
          if (local_2c0 < 4) {
            local_2d4 = 0;
            local_368.m_pFree._4_4_ = 1;
          }
        }
        local_368.m_pState = (mz_zip_internal_state *)strlen(local_2b0);
        if (local_368.m_pState < (mz_zip_internal_state *)0x10000) {
          local_2dc = mz_zip_writer_compute_padding_needed_for_file_alignment(local_2a8);
          if ((long)&((local_368.m_pState)->m_sorted_central_dir_offsets).m_size +
              (ulong)local_2ca + ((mz_zip_array *)local_368.m_pAlloc)->m_size + 2 < 0xffffffff) {
            if ((*(mz_bool *)((long)local_368.m_pAlloc + 100) == 0) &&
               (0xffffffff <
                local_2a8->m_archive_size + (ulong)local_2dc + (long)local_368.m_pState * 2 +
                (ulong)local_2ca + (ulong)in_stack_00000030 +
                ((mz_zip_array *)local_368.m_pAlloc)->m_size + (ulong)in_stack_00000040 + 0x72)) {
              *(mz_bool *)((long)local_368.m_pAlloc + 100) = 1;
            }
            if (((local_368.m_pState == (mz_zip_internal_state *)0x0) ||
                (local_2b0[(long)((long)&local_368.m_pState[-1].m_mem_capacity + 7)] != '/')) ||
               ((local_2d8 = local_2d8 | 0x10, local_2c0 == 0 && (in_stack_00000010 == 0)))) {
              lVar8 = 0;
              if (*(mz_bool *)((long)local_368.m_pAlloc + 100) != 0) {
                lVar8 = 0x1c;
              }
              if ((((mz_zip_array *)local_368.m_pAlloc)->m_capacity <
                   (long)&((local_368.m_pState)->m_central_dir_offsets).m_size +
                   ((mz_zip_array *)local_368.m_pAlloc)->m_size + lVar8 + (ulong)local_2ca + 6) &&
                 (mVar2 = mz_zip_array_ensure_capacity
                                    ((mz_zip_archive *)
                                     CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                                     (mz_zip_array *)
                                     CONCAT26(in_stack_fffffffffffffb96,
                                              CONCAT24(in_stack_fffffffffffffb94,
                                                       in_stack_fffffffffffffb90)),
                                     CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                                     in_stack_fffffffffffffb84), mVar2 == 0)) {
                bVar1 = false;
              }
              else {
                bVar1 = true;
              }
              if (bVar1) {
                if ((((mz_zip_array *)((long)local_368.m_pAlloc + 0x20))->m_capacity <
                     ((mz_zip_array *)((long)local_368.m_pAlloc + 0x20))->m_size + 1) &&
                   (mVar2 = mz_zip_array_ensure_capacity
                                      ((mz_zip_archive *)
                                       CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98)
                                       ,(mz_zip_array *)
                                        CONCAT26(in_stack_fffffffffffffb96,
                                                 CONCAT24(in_stack_fffffffffffffb94,
                                                          in_stack_fffffffffffffb90)),
                                       CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88)
                                       ,in_stack_fffffffffffffb84), mVar2 == 0)) {
                  bVar1 = false;
                }
                else {
                  bVar1 = true;
                }
                if (bVar1) {
                  if (((local_368.m_pFree._4_4_ == 0) && (local_2c0 != 0)) &&
                     (local_368.m_pRealloc =
                           (mz_realloc_func)
                           (*local_2a8->m_pAlloc)(local_2a8->m_pAlloc_opaque,1,0x4df78),
                     local_368.m_pRealloc == (mz_realloc_func)0x0)) {
                    if (local_2a8 != (mz_zip_archive *)0x0) {
                      local_2a8->m_last_error = MZ_ZIP_ALLOC_FAILED;
                    }
                    return 0;
                  }
                  mVar2 = mz_zip_writer_write_zeros
                                    (in_stack_00000b90,in_stack_00000b88,in_stack_00000b84);
                  if (mVar2 == 0) {
                    (*local_2a8->m_pFree)(local_2a8->m_pAlloc_opaque,local_368.m_pRealloc);
                    return 0;
                  }
                  local_2e8 = local_2dc + local_2e8;
                  if ((local_2a8->m_file_offset_alignment != 0) &&
                     ((local_2e8 & local_2a8->m_file_offset_alignment - 1) != 0)) {
                    __assert_fail("(local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/cpp/src/../../Zippy/library/Zippy/miniz/miniz.h"
                                  ,0x1eb0,
                                  "mz_bool mz_zip_writer_add_mem_ex_v2(mz_zip_archive *, const char *, const void *, size_t, const void *, mz_uint16, mz_uint, mz_uint64, mz_uint32, time_t *, const char *, mz_uint, const char *, mz_uint)"
                                 );
                  }
                  local_2f0 = local_2dc + local_2f0;
                  memset(&local_368.m_pAlloc_opaque,0,0x1e);
                  if ((local_368.m_pFree._4_4_ == 0) || ((in_stack_00000008 & 0x400) != 0)) {
                    local_2cc = 8;
                  }
                  if (*(mz_bool *)((long)local_368.m_pAlloc + 100) == 0) {
                    if ((0xffffffff < local_2f8) || (0xffffffff < local_2f0)) {
                      if (local_2a8 != (mz_zip_archive *)0x0) {
                        local_2a8->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
                      }
                      return 0;
                    }
                    pPut_buf_user = (void *)CONCAT44(uVar9,(uint)local_2cc);
                    pPut_buf_func = (tdefl_put_buf_func_ptr)CONCAT44(uVar10,(uint)local_36a);
                    uVar3 = (uint)local_2ce;
                    mVar2 = mz_zip_writer_create_local_dir_header
                                      ((mz_zip_archive *)
                                       CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0)
                                       ,(mz_uint8 *)
                                        CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98
                                                ),in_stack_fffffffffffffb96,
                                       in_stack_fffffffffffffb94,
                                       CONCAT44(in_stack_fffffffffffffb8c,(uint)local_2d0),
                                       CONCAT44(in_stack_fffffffffffffb84,uVar3),
                                       in_stack_fffffffffffffc60,in_stack_fffffffffffffc68,
                                       in_stack_fffffffffffffc70,in_stack_fffffffffffffc78,
                                       in_stack_fffffffffffffc80);
                    if (mVar2 == 0) {
                      if (local_2a8 != (mz_zip_archive *)0x0) {
                        local_2a8->m_last_error = MZ_ZIP_INTERNAL_ERROR;
                      }
                      return 0;
                    }
                    sVar6 = (*local_2a8->m_pWrite)
                                      (local_2a8->m_pIO_opaque,local_2e8,&local_368.m_pAlloc_opaque,
                                       0x1e);
                    if (sVar6 != 0x1e) {
                      if (local_2a8 != (mz_zip_archive *)0x0) {
                        local_2a8->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
                      }
                      return 0;
                    }
                    local_2f0 = local_2f0 + 0x1e;
                    pmVar7 = (mz_zip_internal_state *)
                             (*local_2a8->m_pWrite)
                                       (local_2a8->m_pIO_opaque,local_2f0,local_2b0,
                                        (size_t)local_368.m_pState);
                    if (pmVar7 != local_368.m_pState) {
                      (*local_2a8->m_pFree)(local_2a8->m_pAlloc_opaque,local_368.m_pRealloc);
                      if (local_2a8 != (mz_zip_archive *)0x0) {
                        local_2a8->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
                      }
                      return 0;
                    }
                    local_2f0 = (long)&((local_368.m_pState)->m_central_dir).m_p + local_2f0;
                  }
                  else {
                    if ((0xfffffffe < in_stack_00000010) || (0xfffffffe < local_2e8)) {
                      local_368.m_file_offset_alignment = (mz_uint64)&local_368;
                      if (in_stack_00000010 < 0xffffffff) {
                        local_3c0 = (mz_uint64 *)0x0;
                        local_3d0 = (mz_uint64 *)0x0;
                      }
                      else {
                        local_3c0 = &stack0x00000010;
                        local_3d0 = &local_2f8;
                      }
                      if (local_2e8 < 0xffffffff) {
                        local_3e0 = (mz_uint64 *)0x0;
                      }
                      else {
                        local_3e0 = &local_2e8;
                      }
                      local_368.m_last_error =
                           mz_zip_writer_create_zip64_extra_data
                                     ((mz_uint8 *)&local_368,local_3c0,local_3d0,local_3e0);
                    }
                    pPut_buf_user = (void *)CONCAT44(uVar9,(uint)local_2cc);
                    pPut_buf_func = (tdefl_put_buf_func_ptr)CONCAT44(uVar10,(uint)local_36a);
                    uVar3 = (uint)local_2ce;
                    mVar2 = mz_zip_writer_create_local_dir_header
                                      ((mz_zip_archive *)
                                       CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0)
                                       ,(mz_uint8 *)
                                        CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98
                                                ),in_stack_fffffffffffffb96,
                                       in_stack_fffffffffffffb94,
                                       CONCAT44(in_stack_fffffffffffffb8c,(uint)local_2d0),
                                       CONCAT44(in_stack_fffffffffffffb84,uVar3),
                                       in_stack_fffffffffffffc60,in_stack_fffffffffffffc68,
                                       in_stack_fffffffffffffc70,in_stack_fffffffffffffc78,
                                       in_stack_fffffffffffffc80);
                    if (mVar2 == 0) {
                      if (local_2a8 != (mz_zip_archive *)0x0) {
                        local_2a8->m_last_error = MZ_ZIP_INTERNAL_ERROR;
                      }
                      return 0;
                    }
                    sVar6 = (*local_2a8->m_pWrite)
                                      (local_2a8->m_pIO_opaque,local_2e8,&local_368.m_pAlloc_opaque,
                                       0x1e);
                    if (sVar6 != 0x1e) {
                      if (local_2a8 != (mz_zip_archive *)0x0) {
                        local_2a8->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
                      }
                      return 0;
                    }
                    local_2f0 = local_2f0 + 0x1e;
                    pmVar7 = (mz_zip_internal_state *)
                             (*local_2a8->m_pWrite)
                                       (local_2a8->m_pIO_opaque,local_2f0,local_2b0,
                                        (size_t)local_368.m_pState);
                    if (pmVar7 != local_368.m_pState) {
                      (*local_2a8->m_pFree)(local_2a8->m_pAlloc_opaque,local_368.m_pRealloc);
                      if (local_2a8 != (mz_zip_archive *)0x0) {
                        local_2a8->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
                      }
                      return 0;
                    }
                    local_2f0 = (long)&((local_368.m_pState)->m_central_dir).m_p + local_2f0;
                    if ((mz_zip_archive *)local_368.m_file_offset_alignment != (mz_zip_archive *)0x0
                       ) {
                      sVar6 = (*local_2a8->m_pWrite)
                                        (local_2a8->m_pIO_opaque,local_2f0,&local_368,
                                         (size_t)local_368.m_last_error);
                      if (sVar6 != local_368.m_last_error) {
                        if (local_2a8 != (mz_zip_archive *)0x0) {
                          local_2a8->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
                        }
                        return 0;
                      }
                      local_2f0 = local_368.m_last_error + local_2f0;
                    }
                  }
                  if (in_stack_00000030 != 0) {
                    sVar6 = (*local_2a8->m_pWrite)
                                      (local_2a8->m_pIO_opaque,local_2f0,in_stack_00000028,
                                       (size_t)in_stack_00000030);
                    if (sVar6 != in_stack_00000030) {
                      if (local_2a8 != (mz_zip_archive *)0x0) {
                        local_2a8->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
                      }
                      return 0;
                    }
                    local_2f0 = in_stack_00000030 + local_2f0;
                  }
                  if (local_368.m_pFree._4_4_ == 0) {
                    mVar12 = local_2f8;
                    mVar11 = local_2f0;
                    if (local_2c0 != 0) {
                      mVar12 = 0;
                      tdefl_create_comp_flags_from_zip_params(local_2d4,-0xf,0);
                      tVar4 = tdefl_init((tdefl_compressor *)
                                         CONCAT44(in_stack_fffffffffffffb84,uVar3),pPut_buf_func,
                                         pPut_buf_user,in_stack_fffffffffffffb6c);
                      if ((tVar4 != TDEFL_STATUS_OKAY) ||
                         (tVar4 = tdefl_compress_buffer
                                            ((tdefl_compressor *)
                                             CONCAT44(in_stack_fffffffffffffb84,uVar3),pPut_buf_func
                                             ,(size_t)pPut_buf_user,in_stack_fffffffffffffb6c),
                         tVar4 != TDEFL_STATUS_DONE)) {
                        (*local_2a8->m_pFree)(local_2a8->m_pAlloc_opaque,local_368.m_pRealloc);
                        if (local_2a8 != (mz_zip_archive *)0x0) {
                          local_2a8->m_last_error = MZ_ZIP_COMPRESSION_FAILED;
                        }
                        return 0;
                      }
                    }
                  }
                  else {
                    sVar6 = (*local_2a8->m_pWrite)
                                      (local_2a8->m_pIO_opaque,local_2f0,local_2b8,local_2c0);
                    if (sVar6 != local_2c0) {
                      (*local_2a8->m_pFree)(local_2a8->m_pAlloc_opaque,local_368.m_pRealloc);
                      if (local_2a8 != (mz_zip_archive *)0x0) {
                        local_2a8->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
                      }
                      return 0;
                    }
                    local_2f8 = local_2c0;
                    mVar12 = local_2f8;
                    mVar11 = local_2c0 + local_2f0;
                  }
                  local_2f0 = mVar11;
                  local_2f8 = mVar12;
                  (*local_2a8->m_pFree)(local_2a8->m_pAlloc_opaque,local_368.m_pRealloc);
                  local_368.m_pRealloc = (mz_realloc_func)0x0;
                  if (in_stack_00000010 != 0) {
                    local_3ac = 0x10;
                    if ((local_36a & 8) == 0) {
                      __assert_fail("bit_flags & MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR",
                                    "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/cpp/src/../../Zippy/library/Zippy/miniz/miniz.h"
                                    ,0x1f39,
                                    "mz_bool mz_zip_writer_add_mem_ex_v2(mz_zip_archive *, const char *, const void *, size_t, const void *, mz_uint16, mz_uint, mz_uint64, mz_uint32, time_t *, const char *, mz_uint, const char *, mz_uint)"
                                   );
                    }
                    in_stack_fffffffffffffee4 = 0x8074b50;
                    local_3a8 = 0x50;
                    local_3a7 = 0x4b;
                    local_3a6 = 7;
                    local_3a5 = 8;
                    in_stack_fffffffffffffee8 = (mz_uint)&local_3a8;
                    local_3a4 = (undefined1)in_stack_00000018;
                    local_3a3 = (undefined1)((uint)in_stack_00000018 >> 8);
                    local_3a2 = (undefined1)((uint)in_stack_00000018 >> 0x10);
                    local_3a1 = (undefined1)((uint)in_stack_00000018 >> 0x18);
                    in_stack_fffffffffffffed8 = (mz_uint32)&local_3a4;
                    if ((mz_zip_archive *)local_368.m_file_offset_alignment == (mz_zip_archive *)0x0
                       ) {
                      if (0xffffffff < local_2f8) {
                        if (local_2a8 != (mz_zip_archive *)0x0) {
                          local_2a8->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
                        }
                        return 0;
                      }
                      in_stack_fffffffffffffec8 = (mz_uint16)&stack0xfffffffffffffc60;
                      local_39c = (undefined1)in_stack_00000010;
                      local_39b = (undefined1)(in_stack_00000010 >> 8);
                      local_39a = (undefined1)(in_stack_00000010 >> 0x10);
                      local_399 = (undefined1)(in_stack_00000010 >> 0x18);
                      in_stack_fffffffffffffeb8 = (mz_uint16)&local_39c;
                    }
                    else {
                      local_39c = (undefined1)(local_2f8 >> 0x20);
                      local_39b = (undefined1)(local_2f8 >> 0x28);
                      local_39a = (undefined1)(local_2f8 >> 0x30);
                      local_399 = (undefined1)(local_2f8 >> 0x38);
                      local_3ac = 0x18;
                    }
                    in_stack_fffffffffffffed4 = in_stack_00000018;
                    sVar6 = (*local_2a8->m_pWrite)
                                      (local_2a8->m_pIO_opaque,local_2f0,&local_3a8,
                                       (size_t)local_3ac);
                    if (sVar6 != local_3ac) {
                      return 0;
                    }
                    local_2f0 = local_3ac + local_2f0;
                  }
                  if ((mz_zip_archive *)local_368.m_file_offset_alignment != (mz_zip_archive *)0x0)
                  {
                    in_stack_fffffffffffffc10 = &local_368;
                    if (in_stack_00000010 < 0xffffffff) {
                      pUncomp_size = (mz_uint64 *)0x0;
                      pComp_size = (mz_uint64 *)0x0;
                    }
                    else {
                      pUncomp_size = &stack0x00000010;
                      pComp_size = &local_2f8;
                    }
                    if (local_2e8 < 0xffffffff) {
                      in_stack_fffffffffffffbe8 = (mz_uint64 *)0x0;
                    }
                    else {
                      in_stack_fffffffffffffbe8 = &local_2e8;
                    }
                    in_stack_fffffffffffffbf8 = pComp_size;
                    in_stack_fffffffffffffc08 = pUncomp_size;
                    local_368.m_last_error =
                         mz_zip_writer_create_zip64_extra_data
                                   ((mz_uint8 *)in_stack_fffffffffffffc10,pUncomp_size,pComp_size,
                                    in_stack_fffffffffffffbe8);
                    filename_size = (mz_uint16)((ulong)pUncomp_size >> 0x30);
                    extra_size_00 = (mz_uint16)((ulong)pComp_size >> 0x30);
                  }
                  mVar2 = mz_zip_writer_add_to_central_dir
                                    (in_stack_fffffffffffffc10,(char *)in_stack_fffffffffffffc08,
                                     filename_size,in_stack_fffffffffffffbf8,extra_size_00,
                                     in_stack_fffffffffffffbe8,in_stack_fffffffffffffe90,
                                     in_stack_fffffffffffffe98,
                                     CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                                     in_stack_fffffffffffffea8,in_stack_fffffffffffffeb0,
                                     in_stack_fffffffffffffeb8,in_stack_fffffffffffffec0,
                                     in_stack_fffffffffffffec8,
                                     CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                                     in_stack_fffffffffffffed8,
                                     (char *)CONCAT44(in_stack_fffffffffffffee4,
                                                      in_stack_fffffffffffffee0),
                                     in_stack_fffffffffffffee8);
                  if (mVar2 != 0) {
                    local_2a8->m_total_files = local_2a8->m_total_files + 1;
                    local_2a8->m_archive_size = local_2f0;
                    return 1;
                  }
                  return 0;
                }
              }
              if (local_2a8 != (mz_zip_archive *)0x0) {
                local_2a8->m_last_error = MZ_ZIP_ALLOC_FAILED;
              }
            }
            else if (local_2a8 != (mz_zip_archive *)0x0) {
              local_2a8->m_last_error = MZ_ZIP_INVALID_PARAMETER;
            }
          }
          else if (local_2a8 != (mz_zip_archive *)0x0) {
            local_2a8->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
          }
        }
        else if (local_2a8 != (mz_zip_archive *)0x0) {
          local_2a8->m_last_error = MZ_ZIP_INVALID_FILENAME;
        }
      }
    }
  }
  return 0;
}

Assistant:

inline mz_bool mz_zip_writer_add_mem_ex_v2(mz_zip_archive* pZip,
                                           const char* pArchive_name,
                                           const void* pBuf,
                                           size_t buf_size,
                                           const void* pComment,
                                           mz_uint16 comment_size,
                                           mz_uint level_and_flags,
                                           mz_uint64 uncomp_size,
                                           mz_uint32 uncomp_crc32,
                                           MZ_TIME_T* last_modified,
                                           const char* user_extra_data,
                                           mz_uint user_extra_data_len,
                                           const char* user_extra_data_central,
                                           mz_uint user_extra_data_central_len) {

    mz_uint16 method = 0, dos_time = 0, dos_date = 0;
    mz_uint level, ext_attributes = 0, num_alignment_padding_bytes;
    mz_uint64 local_dir_header_ofs = pZip->m_archive_size, cur_archive_file_ofs = pZip->m_archive_size, comp_size = 0;
    size_t archive_name_size;
    mz_uint8 local_dir_header[MZ_ZIP_LOCAL_DIR_HEADER_SIZE];
    tdefl_compressor* pComp = NULL;
    mz_bool store_data_uncompressed;
    mz_zip_internal_state* pState;
    mz_uint8* pExtra_data = NULL;
    mz_uint32 extra_size = 0;
    mz_uint8 extra_data[MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE];
    mz_uint16 bit_flags = 0;

    if ((int)level_and_flags < 0)
        level_and_flags = MZ_DEFAULT_LEVEL;

    if (uncomp_size || (buf_size && !(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)))
        bit_flags |= MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR;

    if (!(level_and_flags & MZ_ZIP_FLAG_ASCII_FILENAME))
        bit_flags |= MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_UTF8;

    level = level_and_flags & 0xF;
    store_data_uncompressed = ((!level) || (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA));

    if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || ((buf_size) && (!pBuf))
            || (!pArchive_name) || ((comment_size) && (!pComment)) || (level > MZ_UBER_COMPRESSION))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    if (pState->m_zip64) {
        if (pZip->m_total_files == MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }
    else {
        if (pZip->m_total_files == MZ_UINT16_MAX) {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES); */
        }
        if ((buf_size > 0xFFFFFFFF) || (uncomp_size > 0xFFFFFFFF)) {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
        }
    }

    if ((!(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) && (uncomp_size))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (!mz_zip_writer_validate_archive_name(pArchive_name))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

#ifndef MINIZ_NO_TIME
    if (last_modified != NULL) {
        mz_zip_time_t_to_dos_time(*last_modified, &dos_time, &dos_date);
    }
    else {
        MZ_TIME_T cur_time;
        time(&cur_time);
        mz_zip_time_t_to_dos_time(cur_time, &dos_time, &dos_date);
    }
#endif /* #ifndef MINIZ_NO_TIME */

    if (!(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) {
        uncomp_crc32 = (mz_uint32)mz_crc32(MZ_CRC32_INIT, (const mz_uint8*)pBuf, buf_size);
        uncomp_size = buf_size;
        if (uncomp_size <= 3) {
            level = 0;
            store_data_uncompressed = MZ_TRUE;
        }
    }

    archive_name_size = strlen(pArchive_name);
    if (archive_name_size > MZ_UINT16_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

    num_alignment_padding_bytes = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

    /* miniz doesn't support central dirs >= MZ_UINT32_MAX bytes yet */
    if (((mz_uint64)pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size
            + MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE + comment_size) >= MZ_UINT32_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

    if (!pState->m_zip64) {
        /* Bail early if the archive would obviously become too large */
        if ((pZip->m_archive_size + num_alignment_padding_bytes + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + archive_name_size
                + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + comment_size + user_extra_data_len
                + pState->m_central_dir.m_size + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE + user_extra_data_central_len
                + MZ_ZIP_DATA_DESCRIPTER_SIZE32) > 0xFFFFFFFF) {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
        }
    }

    if ((archive_name_size) && (pArchive_name[archive_name_size - 1] == '/')) {
        /* Set DOS Subdirectory attribute bit. */
        ext_attributes |= MZ_ZIP_DOS_DIR_ATTRIBUTE_BITFLAG;

        /* Subdirectories cannot contain data. */
        if ((buf_size) || (uncomp_size))
            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);
    }

    /* Try to do any allocations before writing to the archive, so if an allocation fails the file remains unmodified. (A good idea if we're doing an in-place modification.) */
    if ((!mz_zip_array_ensure_room(pZip,
                                   &pState->m_central_dir,
                                   MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + comment_size
                                           + (pState->m_zip64 ? MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE : 0)))
            || (!mz_zip_array_ensure_room(
                    pZip,
                    &pState->m_central_dir_offsets,
                    1)))
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    if ((!store_data_uncompressed) && (buf_size)) {
        if (NULL == (pComp = (tdefl_compressor*)pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, sizeof(tdefl_compressor))))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    if (!mz_zip_writer_write_zeros(pZip, cur_archive_file_ofs, num_alignment_padding_bytes)) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
        return MZ_FALSE;
    }

    local_dir_header_ofs += num_alignment_padding_bytes;
    if (pZip->m_file_offset_alignment) {
        MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0);
    }
    cur_archive_file_ofs += num_alignment_padding_bytes;

    MZ_CLEAR_OBJ(local_dir_header);

    if (!store_data_uncompressed || (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) {
        method = MZ_DEFLATED;
    }

    if (pState->m_zip64) {
        if (uncomp_size >= MZ_UINT32_MAX || local_dir_header_ofs >= MZ_UINT32_MAX) {
            pExtra_data = extra_data;
            extra_size = mz_zip_writer_create_zip64_extra_data(extra_data,
                                                               (uncomp_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
                                                               (uncomp_size >= MZ_UINT32_MAX) ? &comp_size : NULL,
                                                               (local_dir_header_ofs >= MZ_UINT32_MAX)
                                                               ? &local_dir_header_ofs : NULL);
        }

        if (!mz_zip_writer_create_local_dir_header(pZip,
                                                   local_dir_header,
                                                   (mz_uint16)archive_name_size,
                                                   extra_size + user_extra_data_len,
                                                   0,
                                                   0,
                                                   0,
                                                   method,
                                                   bit_flags,
                                                   dos_time,
                                                   dos_date))
            return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

        if (pZip->m_pWrite(pZip->m_pIO_opaque,
                           local_dir_header_ofs,
                           local_dir_header,
                           sizeof(local_dir_header)) != sizeof(local_dir_header))
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += sizeof(local_dir_header);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name, archive_name_size)
                != archive_name_size) {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }
        cur_archive_file_ofs += archive_name_size;

        if (pExtra_data != NULL) {
            if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, extra_data, extra_size) != extra_size)
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

            cur_archive_file_ofs += extra_size;
        }
    }
    else {
        if ((comp_size > MZ_UINT32_MAX) || (cur_archive_file_ofs > MZ_UINT32_MAX))
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);
        if (!mz_zip_writer_create_local_dir_header(pZip,
                                                   local_dir_header,
                                                   (mz_uint16)archive_name_size,
                                                   user_extra_data_len,
                                                   0,
                                                   0,
                                                   0,
                                                   method,
                                                   bit_flags,
                                                   dos_time,
                                                   dos_date))
            return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

        if (pZip->m_pWrite(pZip->m_pIO_opaque,
                           local_dir_header_ofs,
                           local_dir_header,
                           sizeof(local_dir_header)) != sizeof(local_dir_header))
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += sizeof(local_dir_header);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name, archive_name_size)
                != archive_name_size) {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }
        cur_archive_file_ofs += archive_name_size;
    }

    if (user_extra_data_len > 0) {
        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, user_extra_data, user_extra_data_len)
                != user_extra_data_len)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += user_extra_data_len;
    }

    if (store_data_uncompressed) {
        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pBuf, buf_size) != buf_size) {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }

        cur_archive_file_ofs += buf_size;
        comp_size = buf_size;
    }
    else if (buf_size) {
        mz_zip_writer_add_state state;

        state.m_pZip = pZip;
        state.m_cur_archive_file_ofs = cur_archive_file_ofs;
        state.m_comp_size = 0;

        if ((tdefl_init(pComp,
                        mz_zip_writer_add_put_buf_callback,
                        &state,
                        tdefl_create_comp_flags_from_zip_params(level,
                                                                -15,
                                                                MZ_DEFAULT_STRATEGY)) != TDEFL_STATUS_OKAY)
                || (tdefl_compress_buffer(
                        pComp,
                        pBuf,
                        buf_size,
                        TDEFL_FINISH) != TDEFL_STATUS_DONE)) {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_COMPRESSION_FAILED);
        }

        comp_size = state.m_comp_size;
        cur_archive_file_ofs = state.m_cur_archive_file_ofs;
    }

    pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
    pComp = NULL;

    if (uncomp_size) {
        mz_uint8 local_dir_footer[MZ_ZIP_DATA_DESCRIPTER_SIZE64];
        mz_uint32 local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE32;

        MZ_ASSERT(bit_flags & MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR);

        MZ_WRITE_LE32(local_dir_footer + 0, MZ_ZIP_DATA_DESCRIPTOR_ID);
        MZ_WRITE_LE32(local_dir_footer + 4, uncomp_crc32);
        if (pExtra_data == NULL) {
            if (comp_size > MZ_UINT32_MAX)
                return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

            MZ_WRITE_LE32(local_dir_footer + 8, comp_size);
            MZ_WRITE_LE32(local_dir_footer + 12, uncomp_size);
        }
        else {
            MZ_WRITE_LE64(local_dir_footer + 8, comp_size);
            MZ_WRITE_LE64(local_dir_footer + 16, uncomp_size);
            local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE64;
        }

        if (pZip->m_pWrite(pZip->m_pIO_opaque,
                           cur_archive_file_ofs,
                           local_dir_footer,
                           local_dir_footer_size) != local_dir_footer_size)
            return MZ_FALSE;

        cur_archive_file_ofs += local_dir_footer_size;
    }

    if (pExtra_data != NULL) {
        extra_size = mz_zip_writer_create_zip64_extra_data(extra_data,
                                                           (uncomp_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
                                                           (uncomp_size >= MZ_UINT32_MAX) ? &comp_size : NULL,
                                                           (local_dir_header_ofs >= MZ_UINT32_MAX)
                                                           ? &local_dir_header_ofs : NULL);
    }

    if (!mz_zip_writer_add_to_central_dir(pZip,
                                          pArchive_name,
                                          (mz_uint16)archive_name_size,
                                          pExtra_data,
                                          extra_size,
                                          pComment,
                                          comment_size,
                                          uncomp_size,
                                          comp_size,
                                          uncomp_crc32,
                                          method,
                                          bit_flags,
                                          dos_time,
                                          dos_date,
                                          local_dir_header_ofs,
                                          ext_attributes,
                                          user_extra_data_central,
                                          user_extra_data_central_len))
        return MZ_FALSE;

    pZip->m_total_files++;
    pZip->m_archive_size = cur_archive_file_ofs;

    return MZ_TRUE;
}